

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

void panicuraid(int sig,siginfo_t *info,void *context)

{
  __pid_t __pgrp;
  char *pcVar1;
  char *__format;
  ulong uVar2;
  char *pcVar3;
  
  uVar2 = (ulong)(uint)sig;
  switch(sig) {
  case 1:
    snprintf(panicuraid::errormsg,200,"HANGUP signalled.\n%s",
             "Please record the signal and code information\nand do a \'v\' before trying anything else."
            );
    __pgrp = getpgrp();
    killpg(__pgrp,9);
    exit(0);
  default:
    pcVar1 = strsignal(sig);
    __format = "Uncaught SIGNAL %s (%d).\n%s";
    pcVar3 = 
    "Please record the signal and code information\nand do a \'v\' before trying anything else.";
    break;
  case 4:
  case 7:
  case 0xb:
    pcVar3 = strsignal(sig);
    snprintf(panicuraid::errormsg,200,"%s at address %p.\n%s",pcVar3,
             (info->_sifields)._sigfault.si_addr,
             "Please record the signal and code information\nand do a \'v\' before trying anything else."
            );
    goto LAB_00135294;
  case 8:
    pcVar1 = strsignal(8);
    uVar2 = (ulong)(uint)info->si_code;
    pcVar3 = (char *)(info->_sifields)._sigfault.si_addr;
    __format = "%s (%d) at address %p.\n%s";
    break;
  case 0xd:
    snprintf(panicuraid::errormsg,200,"Broken PIPE.\n%s",
             "Please record the signal and code information\nand do a \'v\' before trying anything else."
            );
    goto LAB_00135294;
  }
  snprintf(panicuraid::errormsg,200,__format,pcVar1,uVar2,pcVar3);
LAB_00135294:
  error(panicuraid::errormsg);
  return;
}

Assistant:

static void panicuraid(int sig, siginfo_t *info, void *context)
{
  static char errormsg[200];
  static char *stdmsg =
      "Please record the signal and code information\n\
and do a 'v' before trying anything else.";

  switch (sig) {
    case SIGBUS:
    case SIGILL:
    case SIGSEGV:
      snprintf(errormsg, sizeof(errormsg), "%s at address %p.\n%s", strsignal(sig), info->si_addr, stdmsg);
      break;
    case SIGPIPE:
      snprintf(errormsg, sizeof(errormsg), "Broken PIPE.\n%s", stdmsg);
      break;
    case SIGHUP:
      snprintf(errormsg, sizeof(errormsg), "HANGUP signalled.\n%s", stdmsg);
      /* Assume that a user tried to exit UNIX shell */
      killpg(getpgrp(), SIGKILL);
      exit(0);
    case SIGFPE:
      snprintf(errormsg, sizeof(errormsg), "%s (%d) at address %p.\n%s", strsignal(sig), info->si_code, info->si_addr, stdmsg);
      break;
    default: snprintf(errormsg, sizeof(errormsg), "Uncaught SIGNAL %s (%d).\n%s", strsignal(sig), sig, stdmsg);
  }

  error(errormsg);
}